

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectAnds(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vNodes,Vec_Int_t *vLeaves)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int iLeaf;
  int i;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vNodes_local;
  int nNodes_local;
  int *pNodes_local;
  Gia_Man_t *p_local;
  
  Gia_ObjSetTravIdCurrentId(p,0);
  if (vLeaves != (Vec_Int_t *)0x0) {
    for (pObj._4_4_ = 0; iVar1 = Vec_IntSize(vLeaves), pObj._4_4_ < iVar1;
        pObj._4_4_ = pObj._4_4_ + 1) {
      iVar1 = Vec_IntEntry(vLeaves,pObj._4_4_);
      Gia_ObjSetTravIdCurrentId(p,iVar1);
    }
  }
  Vec_IntClear(vNodes);
  for (pObj._4_4_ = 0; pObj._4_4_ < nNodes; pObj._4_4_ = pObj._4_4_ + 1) {
    pObj_00 = Gia_ManObj(p,pNodes[pObj._4_4_]);
    iVar1 = Gia_ObjIsCo(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj_00);
      if (iVar1 != 0) {
        Gia_ManCollectAnds_rec(p,pNodes[pObj._4_4_],vNodes);
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0(pObj_00,pNodes[pObj._4_4_]);
      Gia_ManCollectAnds_rec(p,iVar1,vNodes);
    }
  }
  return;
}

Assistant:

void Gia_ManCollectAnds( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vNodes, Vec_Int_t * vLeaves )
{
    int i, iLeaf; 
//    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    if ( vLeaves )
        Vec_IntForEachEntry( vLeaves, iLeaf, i )
            Gia_ObjSetTravIdCurrentId( p, iLeaf );
    Vec_IntClear( vNodes );
    for ( i = 0; i < nNodes; i++ )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectAnds_rec( p, Gia_ObjFaninId0(pObj, pNodes[i]), vNodes );
        else if ( Gia_ObjIsAnd(pObj) )
            Gia_ManCollectAnds_rec( p, pNodes[i], vNodes );
    }
}